

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

int run_test_fs_readdir_non_empty_dir(void)

{
  void *dir;
  ssize_t sVar1;
  int iVar2;
  uv_loop_t *puVar3;
  void *pvVar4;
  undefined8 uVar5;
  char *__format;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  int64_t eval_b_3;
  int64_t eval_b_21;
  uv_fs_t rmdir_req;
  uv_fs_t close_req;
  uv_fs_t create_req;
  uv_fs_t mkdir_req;
  
  cleanup_test_files();
  puVar3 = uv_default_loop();
  iVar2 = uv_fs_mkdir(puVar3,&mkdir_req,"test_dir",0x1ed,(uv_fs_cb)0x0);
  rmdir_req.data = (void *)(long)iVar2;
  create_req.data = (void *)0x0;
  if (rmdir_req.data == (void *)0x0) {
    puVar3 = uv_default_loop();
    iVar2 = uv_fs_open(puVar3,&create_req,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    sVar1 = create_req.result;
    rmdir_req.data = (void *)(long)iVar2;
    if (rmdir_req.data == (void *)0x0) {
      rmdir_req.data = (void *)create_req.result;
      close_req.data = (void *)0x0;
      if (-1 < create_req.result) {
        uv_fs_req_cleanup(&create_req);
        puVar3 = uv_default_loop();
        iVar2 = uv_fs_close(puVar3,&close_req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
        pvVar4 = (void *)(long)iVar2;
        eval_b_3 = 0;
        rmdir_req.data = pvVar4;
        if (pvVar4 == (void *)0x0) {
          uv_fs_req_cleanup(&close_req);
          puVar3 = uv_default_loop();
          iVar2 = uv_fs_open(puVar3,&create_req,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
          pvVar4 = (void *)(long)iVar2;
          eval_b_3 = 0;
          if (pvVar4 == (void *)0x0) {
            rmdir_req.data = (void *)create_req.result;
            eval_b_3 = 0;
            if (create_req.result < 0) {
              pcVar7 = ">=";
              pcVar8 = "0";
              pcVar6 = "create_req.result";
              uVar5 = 0x17b;
              pvVar4 = (void *)create_req.result;
            }
            else {
              uv_fs_req_cleanup(&create_req);
              puVar3 = uv_default_loop();
              iVar2 = uv_fs_close(puVar3,&close_req,(uv_os_fd_t)create_req.result,(uv_fs_cb)0x0);
              pvVar4 = (void *)(long)iVar2;
              eval_b_3 = 0;
              rmdir_req.data = pvVar4;
              if (pvVar4 == (void *)0x0) {
                uv_fs_req_cleanup(&close_req);
                puVar3 = uv_default_loop();
                iVar2 = uv_fs_mkdir(puVar3,&mkdir_req,"test_dir/test_subdir",0x1ed,(uv_fs_cb)0x0);
                pvVar4 = (void *)(long)iVar2;
                eval_b_3 = 0;
                rmdir_req.data = pvVar4;
                if (pvVar4 == (void *)0x0) {
                  uv_fs_req_cleanup(&mkdir_req);
                  memset(&opendir_req,0xdb,0x1c0);
                  puVar3 = uv_default_loop();
                  iVar2 = uv_fs_opendir(puVar3,&opendir_req,"test_dir",(uv_fs_cb)0x0);
                  dir = opendir_req.ptr;
                  pvVar4 = (void *)(long)iVar2;
                  eval_b_3 = 0;
                  if (pvVar4 == (void *)0x0) {
                    pvVar4 = (void *)(long)opendir_req.fs_type;
                    eval_b_3 = 0x1f;
                    if (pvVar4 == (void *)0x1f) {
                      rmdir_req.data = (void *)opendir_req.result;
                      eval_b_3 = 0;
                      if (opendir_req.result == 0) {
                        if (opendir_req.ptr == (void *)0x0) {
                          eval_b_3 = 0;
                          pcVar7 = "!=";
                          pvVar4 = (void *)0x0;
                          pcVar8 = "NULL";
                          __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
                          pcVar6 = "opendir_req.ptr";
                          uVar5 = 0x192;
                          goto LAB_00122e7d;
                        }
                        *(uv_dirent_t **)opendir_req.ptr = dirents;
                        *(undefined8 *)((long)dir + 8) = 1;
                        uv_fs_req_cleanup(&opendir_req);
                        lVar9 = 0;
                        while( true ) {
                          puVar3 = uv_default_loop();
                          iVar2 = uv_fs_readdir(puVar3,&readdir_req,(uv_dir_t *)dir,(uv_fs_cb)0x0);
                          pcVar6 = dirents[0].name;
                          if (iVar2 == 0) break;
                          iVar2 = strcmp(dirents[0].name,"file1");
                          if (((iVar2 != 0) && (iVar2 = strcmp(pcVar6,"file2"), iVar2 != 0)) &&
                             (iVar2 = strcmp(pcVar6,"test_subdir"), iVar2 != 0)) {
                            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
                                    ,0x1a0,
                                    "strcmp(dirents[0].name, \"file1\") == 0 || strcmp(dirents[0].name, \"file2\") == 0 || strcmp(dirents[0].name, \"test_subdir\") == 0"
                                   );
                            abort();
                          }
                          iVar2 = strcmp(pcVar6,"test_subdir");
                          if (iVar2 == 0) {
                            pvVar4 = (void *)(ulong)dirents[0].type;
                            eval_b_3 = 2;
                            if (pvVar4 != (void *)0x2) {
                              pcVar7 = "==";
                              pcVar8 = "UV_DIRENT_DIR";
                              pcVar6 = "dirents[0].type";
                              uVar5 = 0x1a3;
                              rmdir_req.data = pvVar4;
                              goto LAB_00122e7b;
                            }
                          }
                          else {
                            pvVar4 = (void *)(ulong)dirents[0].type;
                            eval_b_3 = 1;
                            if (pvVar4 != (void *)0x1) {
                              pcVar7 = "==";
                              pcVar8 = "UV_DIRENT_FILE";
                              pcVar6 = "dirents[0].type";
                              uVar5 = 0x1a5;
                              rmdir_req.data = pvVar4;
                              goto LAB_00122e7b;
                            }
                          }
                          rmdir_req.data = (void *)(ulong)dirents[0].type;
                          uv_fs_req_cleanup(&readdir_req);
                          lVar9 = lVar9 + 1;
                        }
                        rmdir_req.data = (void *)0x3;
                        if (lVar9 == 3) {
                          uv_fs_req_cleanup(&readdir_req);
                          memset(&closedir_req,0xdb,0x1c0);
                          puVar3 = uv_default_loop();
                          uv_fs_closedir(puVar3,&closedir_req,(uv_dir_t *)dir,(uv_fs_cb)0x0);
                          rmdir_req.data = (void *)closedir_req.result;
                          eval_b_3 = 0;
                          if (closedir_req.result == 0) {
                            uv_fs_req_cleanup(&closedir_req);
                            memset(&opendir_req,0xdb,0x1c0);
                            puVar3 = uv_default_loop();
                            iVar2 = uv_fs_opendir(puVar3,&opendir_req,"test_dir",
                                                  non_empty_opendir_cb);
                            pvVar4 = (void *)(long)iVar2;
                            eval_b_3 = 0;
                            if (pvVar4 == (void *)0x0) {
                              pvVar4 = (void *)(long)non_empty_opendir_cb_count;
                              eval_b_3 = 0;
                              if (pvVar4 == (void *)0x0) {
                                rmdir_req.data = (void *)(long)non_empty_closedir_cb_count;
                                eval_b_3 = 0;
                                if (rmdir_req.data == (void *)0x0) {
                                  puVar3 = uv_default_loop();
                                  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
                                  pvVar4 = (void *)(long)iVar2;
                                  eval_b_3 = 0;
                                  if (pvVar4 == (void *)0x0) {
                                    rmdir_req.data = (void *)0x1;
                                    if ((long)non_empty_opendir_cb_count == 1) {
                                      rmdir_req.data = (void *)0x1;
                                      if ((long)non_empty_closedir_cb_count == 1) {
                                        puVar3 = uv_default_loop();
                                        uv_fs_rmdir(puVar3,&rmdir_req,"test_subdir",(uv_fs_cb)0x0);
                                        uv_fs_req_cleanup(&rmdir_req);
                                        cleanup_test_files();
                                        puVar3 = uv_default_loop();
                                        close_loop(puVar3);
                                        puVar3 = uv_default_loop();
                                        iVar2 = uv_loop_close(puVar3);
                                        if ((long)iVar2 == 0) {
                                          uv_library_shutdown();
                                          return 0;
                                        }
                                        pcVar8 = "uv_loop_close(uv_default_loop())";
                                        pcVar6 = "0";
                                        uVar5 = 0x1cb;
                                        pcVar7 = "==";
                                        pvVar4 = (void *)0x0;
                                        eval_b_3 = (long)iVar2;
                                      }
                                      else {
                                        pcVar7 = "==";
                                        pcVar8 = "non_empty_closedir_cb_count";
                                        pcVar6 = "1";
                                        uVar5 = 0x1c5;
                                        pvVar4 = rmdir_req.data;
                                        eval_b_3 = (long)non_empty_closedir_cb_count;
                                      }
                                    }
                                    else {
                                      pcVar7 = "==";
                                      pcVar8 = "non_empty_opendir_cb_count";
                                      pcVar6 = "1";
                                      uVar5 = 0x1c4;
                                      pvVar4 = rmdir_req.data;
                                      eval_b_3 = (long)non_empty_opendir_cb_count;
                                    }
                                  }
                                  else {
                                    pcVar7 = "==";
                                    pcVar8 = "0";
                                    pcVar6 = "r";
                                    uVar5 = 0x1c3;
                                    rmdir_req.data = pvVar4;
                                  }
                                }
                                else {
                                  pcVar7 = "==";
                                  pcVar8 = "0";
                                  pcVar6 = "non_empty_closedir_cb_count";
                                  uVar5 = 0x1c1;
                                  pvVar4 = rmdir_req.data;
                                }
                              }
                              else {
                                pcVar7 = "==";
                                pcVar8 = "0";
                                pcVar6 = "non_empty_opendir_cb_count";
                                uVar5 = 0x1c0;
                                rmdir_req.data = pvVar4;
                              }
                            }
                            else {
                              pcVar7 = "==";
                              pcVar8 = "0";
                              pcVar6 = "r";
                              uVar5 = 0x1bf;
                              rmdir_req.data = pvVar4;
                            }
                          }
                          else {
                            pcVar7 = "==";
                            pcVar8 = "0";
                            pcVar6 = "closedir_req.result";
                            uVar5 = 0x1b3;
                            pvVar4 = (void *)closedir_req.result;
                          }
                        }
                        else {
                          pcVar7 = "==";
                          pcVar8 = "entries_count";
                          pcVar6 = "3";
                          uVar5 = 0x1ad;
                          pvVar4 = rmdir_req.data;
                          eval_b_3 = lVar9;
                        }
                      }
                      else {
                        pcVar7 = "==";
                        pcVar8 = "0";
                        pcVar6 = "opendir_req.result";
                        uVar5 = 0x191;
                        pvVar4 = (void *)opendir_req.result;
                      }
                    }
                    else {
                      pcVar7 = "==";
                      pcVar8 = "UV_FS_OPENDIR";
                      pcVar6 = "opendir_req.fs_type";
                      uVar5 = 400;
                      rmdir_req.data = pvVar4;
                    }
                  }
                  else {
                    pcVar7 = "==";
                    pcVar8 = "0";
                    pcVar6 = "r";
                    uVar5 = 399;
                    rmdir_req.data = pvVar4;
                  }
                }
                else {
                  pcVar7 = "==";
                  pcVar8 = "0";
                  pcVar6 = "r";
                  uVar5 = 0x187;
                }
              }
              else {
                pcVar7 = "==";
                pcVar8 = "0";
                pcVar6 = "r";
                uVar5 = 0x17f;
              }
            }
          }
          else {
            pcVar7 = "==";
            pcVar8 = "0";
            pcVar6 = "r";
            uVar5 = 0x17a;
            rmdir_req.data = pvVar4;
          }
        }
        else {
          pcVar7 = "==";
          pcVar8 = "0";
          pcVar6 = "r";
          uVar5 = 0x172;
        }
        goto LAB_00122e7b;
      }
      pcVar7 = ">=";
      pcVar6 = "create_req.result";
      uVar5 = 0x16e;
    }
    else {
      pcVar7 = "==";
      pcVar6 = "r";
      uVar5 = 0x16d;
    }
    close_req.data = (void *)0x0;
    pcVar8 = "0";
    pvVar4 = rmdir_req.data;
    eval_b_3 = 0;
  }
  else {
    pcVar7 = "==";
    pcVar8 = "0";
    pcVar6 = "r";
    uVar5 = 0x165;
    pvVar4 = rmdir_req.data;
    eval_b_3 = 0;
  }
LAB_00122e7b:
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_00122e7d:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
          ,uVar5,pcVar6,pcVar7,pcVar8,pvVar4,pcVar7,eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(fs_readdir_non_empty_dir) {
  size_t entries_count;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  uv_fs_t create_req;
  uv_fs_t close_req;
  uv_dir_t* dir;
  uv_os_fd_t file;
  int r;

  cleanup_test_files();

  r = uv_fs_mkdir(uv_default_loop(), &mkdir_req, "test_dir", 0755, NULL);
  ASSERT_OK(r);

  /* Create two files synchronously. */
  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file1",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(uv_default_loop(),
                 &create_req,
                 "test_dir/file2",
                 UV_FS_O_WRONLY | UV_FS_O_CREAT, S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  ASSERT_GE(create_req.result, 0);
  file = (uv_os_fd_t) create_req.result;
  uv_fs_req_cleanup(&create_req);
  r = uv_fs_close(uv_default_loop(), &close_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_mkdir(uv_default_loop(),
                  &mkdir_req,
                  "test_dir/test_subdir",
                  0755,
                  NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(), &opendir_req, "test_dir", NULL);
  ASSERT_OK(r);
  ASSERT_EQ(opendir_req.fs_type, UV_FS_OPENDIR);
  ASSERT_OK(opendir_req.result);
  ASSERT_NOT_NULL(opendir_req.ptr);

  entries_count = 0;
  dir = opendir_req.ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  uv_fs_req_cleanup(&opendir_req);

  while (uv_fs_readdir(uv_default_loop(),
                       &readdir_req,
                       dir,
                       NULL) != 0) {
  ASSERT(strcmp(dirents[0].name, "file1") == 0 ||
         strcmp(dirents[0].name, "file2") == 0 ||
         strcmp(dirents[0].name, "test_subdir") == 0);
#ifdef HAVE_DIRENT_TYPES
    if (!strcmp(dirents[0].name, "test_subdir"))
      ASSERT_EQ(dirents[0].type, UV_DIRENT_DIR);
    else
      ASSERT_EQ(dirents[0].type, UV_DIRENT_FILE);
#else
    ASSERT_EQ(dirents[0].type, UV_DIRENT_UNKNOWN);
#endif /* HAVE_DIRENT_TYPES */
    uv_fs_req_cleanup(&readdir_req);
    ++entries_count;
  }

  ASSERT_EQ(3, entries_count);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT_OK(closedir_req.result);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    "test_dir",
                    non_empty_opendir_cb);
  ASSERT_OK(r);
  ASSERT_OK(non_empty_opendir_cb_count);
  ASSERT_OK(non_empty_closedir_cb_count);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);
  ASSERT_EQ(1, non_empty_opendir_cb_count);
  ASSERT_EQ(1, non_empty_closedir_cb_count);

  uv_fs_rmdir(uv_default_loop(), &rmdir_req, "test_subdir", NULL);
  uv_fs_req_cleanup(&rmdir_req);

  cleanup_test_files();
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
 }